

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O3

CURLcode connect_init(Curl_easy *data,_Bool reinit)

{
  connectdata *conn;
  CURLcode CVar1;
  http_connect_state *phVar2;
  
  conn = data->conn;
  if ((conn->handler->flags & 0x4000) != 0) {
    Curl_failf(data,"%s cannot be done over CONNECT",conn->handler->scheme);
    return CURLE_UNSUPPORTED_PROTOCOL;
  }
  if (reinit) {
    phVar2 = conn->connect_state;
    Curl_dyn_reset(&phVar2->rcvbuf);
  }
  else {
    CVar1 = Curl_get_upload_buffer(data);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    phVar2 = (http_connect_state *)(*Curl_ccalloc)(1,0x358);
    if (phVar2 == (http_connect_state *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    Curl_infof(data,"allocate connect buffer");
    conn->connect_state = phVar2;
    Curl_dyn_init(&phVar2->rcvbuf,0x4000);
    phVar2->prot_save = (HTTP *)(data->req).p;
    (data->req).p.rtsp = (RTSP *)phVar2;
    Curl_conncontrol(conn,0);
  }
  phVar2->tunnel_state = TUNNEL_INIT;
  phVar2->keepon = KEEPON_CONNECT;
  phVar2->cl = 0;
  phVar2->field_0x354 = phVar2->field_0x354 & 0xfd;
  return CURLE_OK;
}

Assistant:

static CURLcode connect_init(struct Curl_easy *data, bool reinit)
{
  struct http_connect_state *s;
  struct connectdata *conn = data->conn;
  if(conn->handler->flags & PROTOPT_NOTCPPROXY) {
    failf(data, "%s cannot be done over CONNECT", conn->handler->scheme);
    return CURLE_UNSUPPORTED_PROTOCOL;
  }
  if(!reinit) {
    CURLcode result;
    DEBUGASSERT(!conn->connect_state);
    /* we might need the upload buffer for streaming a partial request */
    result = Curl_get_upload_buffer(data);
    if(result)
      return result;

    s = calloc(1, sizeof(struct http_connect_state));
    if(!s)
      return CURLE_OUT_OF_MEMORY;
    infof(data, "allocate connect buffer");
    conn->connect_state = s;
    Curl_dyn_init(&s->rcvbuf, DYN_PROXY_CONNECT_HEADERS);

    /* Curl_proxyCONNECT is based on a pointer to a struct HTTP at the
     * member conn->proto.http; we want [protocol] through HTTP and we have
     * to change the member temporarily for connecting to the HTTP
     * proxy. After Curl_proxyCONNECT we have to set back the member to the
     * original pointer
     *
     * This function might be called several times in the multi interface case
     * if the proxy's CONNECT response is not instant.
     */
    s->prot_save = data->req.p.http;
    data->req.p.http = &s->http_proxy;
    connkeep(conn, "HTTP proxy CONNECT");
  }
  else {
    DEBUGASSERT(conn->connect_state);
    s = conn->connect_state;
    Curl_dyn_reset(&s->rcvbuf);
  }
  s->tunnel_state = TUNNEL_INIT;
  s->keepon = KEEPON_CONNECT;
  s->cl = 0;
  s->close_connection = FALSE;
  return CURLE_OK;
}